

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Dsdb(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  If_DsdMan_t *p;
  Gia_Man_t *pNew;
  char *pcVar5;
  uint fVerbose;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  local_48 = 8;
  local_3c = 6;
  local_44 = 0;
  local_4c = 0;
  fVerbose = 0;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"LWKCRvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 < 0x4c) {
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          if (0xc < local_3c) {
            printf("Abc_CommandAbc9Dsdb(): Size of the required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n"
                   ,(ulong)local_3c,0xc);
            return 0;
          }
          pvVar4 = Abc_FrameReadManDsd2();
          if (pvVar4 != (void *)0x0) {
            p = (If_DsdMan_t *)Abc_FrameReadManDsd2();
            iVar3 = If_DsdManVarNum(p);
            if (iVar3 < (int)local_3c) {
              puts(
                  "Abc_CommandAbc9Dsdb(): Incompatible size of the DSD manager (run \"dsd_free -b\")."
                  );
              return 0;
            }
          }
          if (local_40 == 0 && local_44 == 0) {
            pNew = Gia_ManPerformDsdBalance(pAbc->pGia,local_3c,local_48,local_4c,fVerbose);
          }
          else {
            pNew = Gia_ManPerformDsdBalanceWin
                             (pAbc->pGia,local_40,local_44,local_3c,local_48,local_4c,fVerbose);
          }
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar5 = "Abc_CommandAbc9Dsdb(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_002824ef;
      }
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
          goto LAB_00282417;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_48 = uVar2;
      }
      else {
        if (iVar1 != 0x4b) goto LAB_00282423;
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_00282417:
          Abc_Print(-1,pcVar5);
          goto LAB_00282423;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_3c = uVar2;
      }
    }
    else if (iVar1 == 0x57) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_00282417;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    else {
      if (iVar1 != 0x52) {
        if (iVar1 == 0x4c) {
          if (argc <= globalUtilOptind) {
            pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
            goto LAB_00282417;
          }
          uVar2 = atoi(argv[globalUtilOptind]);
          local_40 = uVar2;
          goto LAB_00282313;
        }
        goto LAB_00282423;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_00282417;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_4c = uVar2;
    }
LAB_00282313:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_00282423:
      Abc_Print(-2,"usage: &dsdb [-LWKCR num] [-vh]\n");
      Abc_Print(-2,"\t         performs DSD balancing\n");
      Abc_Print(-2,"\t-L num : optimize paths above this level [default = %d]\n",(ulong)local_40);
      Abc_Print(-2,"\t-W num : optimize paths falling into this window [default = %d]\n",
                (ulong)local_44);
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",(ulong)local_3c
               );
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-R num : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)local_4c);
      pcVar5 = "yes";
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_002824ef:
      Abc_Print(iVar3,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Dsdb( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int nLevelMax   = 0;
    int nTimeWindow = 0;
    int nLutSize    = 6;
    int nCutNum     = 8;
    int nRelaxRatio = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LWKCRvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRelaxRatio < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dsdb(): There is no AIG.\n" );
        return 1;
    }
    if ( nLutSize > DAU_MAX_VAR )
    {
        printf( "Abc_CommandAbc9Dsdb(): Size of the required DSD manager (%d) exceeds the precompiled limit (%d) (change parameter DAU_MAX_VAR).\n", nLutSize, DAU_MAX_VAR );
        return 0;
    }
    if ( Abc_FrameReadManDsd2() && nLutSize > If_DsdManVarNum((If_DsdMan_t*)Abc_FrameReadManDsd2()) )
    {
        printf( "Abc_CommandAbc9Dsdb(): Incompatible size of the DSD manager (run \"dsd_free -b\").\n" );
        return 0;
    }
    if ( nLevelMax || nTimeWindow )
        pTemp = Gia_ManPerformDsdBalanceWin( pAbc->pGia, nLevelMax, nTimeWindow, nLutSize, nCutNum, nRelaxRatio, fVerbose );
    else
        pTemp = Gia_ManPerformDsdBalance( pAbc->pGia, nLutSize, nCutNum, nRelaxRatio, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dsdb [-LWKCR num] [-vh]\n" );
    Abc_Print( -2, "\t         performs DSD balancing\n" );
    Abc_Print( -2, "\t-L num : optimize paths above this level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : optimize paths falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n", nCutNum );
    Abc_Print( -2, "\t-R num : the delay relaxation ratio (num >= 0) [default = %d]\n", nRelaxRatio );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}